

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O0

expression_ptr __thiscall mjs::parser::parse_member_expression(parser *this)

{
  bool bVar1;
  token_type tVar2;
  int iVar3;
  wstring *pwVar4;
  pointer psVar5;
  block_statement *this_00;
  socklen_t *in_RCX;
  unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_> *args_2;
  parser *in_RSI;
  bool local_2a1;
  wstring local_280;
  token local_260;
  undefined1 local_238 [16];
  undefined1 local_228 [8];
  undefined1 local_220 [48];
  undefined1 local_1f0 [48];
  undefined1 local_1c0 [8];
  expression_ptr e_1;
  undefined1 local_190 [24];
  undefined1 local_178 [16];
  type *block;
  type *params;
  type *extend;
  undefined1 local_120 [8];
  token id_token;
  source_extend id_extend;
  wstring id;
  undefined1 local_b8 [48];
  undefined1 local_88 [32];
  undefined1 local_68 [8];
  undefined1 local_60 [8];
  expression_ptr e;
  undefined1 local_48 [40];
  unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_> local_20;
  expression_ptr me;
  parser *this_local;
  
  std::unique_ptr<mjs::expression,std::default_delete<mjs::expression>>::
  unique_ptr<std::default_delete<mjs::expression>,void>
            ((unique_ptr<mjs::expression,std::default_delete<mjs::expression>> *)&local_20);
  iVar3 = (int)in_RSI;
  accept((parser *)local_48,iVar3,(sockaddr *)0x59,in_RCX);
  bVar1 = token::operator_cast_to_bool((token *)local_48);
  token::~token((token *)local_48);
  if (bVar1) {
    parse_member_expression((parser *)local_60);
    tVar2 = current_token_type(in_RSI);
    if (tVar2 == lparen) {
      parse_argument_list((expression_list *)(local_88 + 8),in_RSI);
      make_expression<mjs::call_expression,std::unique_ptr<mjs::expression,std::default_delete<mjs::expression>>,std::vector<std::unique_ptr<mjs::expression,std::default_delete<mjs::expression>>,std::allocator<std::unique_ptr<mjs::expression,std::default_delete<mjs::expression>>>>>
                ((parser *)local_68,
                 (unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_> *)in_RSI,
                 (vector<std::unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_>,_std::allocator<std::unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_>_>_>
                  *)local_60);
      std::unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_>::operator=
                ((unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_> *)local_60,
                 (unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_> *)local_68);
      std::unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_>::~unique_ptr
                ((unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_> *)local_68);
      std::
      vector<std::unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_>,_std::allocator<std::unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_>_>_>
      ::~vector((vector<std::unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_>,_std::allocator<std::unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_>_>_>
                 *)(local_88 + 8));
    }
    local_b8._44_4_ = 0x59;
    args_2 = (unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_> *)local_60;
    make_expression<mjs::prefix_expression,mjs::token_type,std::unique_ptr<mjs::expression,std::default_delete<mjs::expression>>>
              ((parser *)local_88,(token_type *)in_RSI,
               (unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_> *)
               (local_b8 + 0x2c));
    std::unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_>::operator=
              (&local_20,
               (unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_> *)local_88);
    std::unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_>::~unique_ptr
              ((unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_> *)local_88);
    std::unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_>::~unique_ptr
              ((unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_> *)local_60);
  }
  else {
    args_2 = (unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_> *)
             (ulong)in_RSI->version_;
    local_2a1 = false;
    if (0 < (int)in_RSI->version_) {
      accept((parser *)local_b8,iVar3,(sockaddr *)0x4d,(socklen_t *)args_2);
      local_2a1 = token::operator_cast_to_bool((token *)local_b8);
      token::~token((token *)local_b8);
    }
    if (local_2a1 != false) {
      std::__cxx11::wstring::wstring((wstring *)&id_extend.start);
      current_extend((source_extend *)((long)&id_token.field_1 + 0x18),in_RSI);
      accept((parser *)local_120,iVar3,(sockaddr *)0x2,(socklen_t *)args_2);
      bVar1 = token::operator_cast_to_bool((token *)local_120);
      if (bVar1) {
        pwVar4 = token::text_abi_cxx11_((token *)local_120);
        std::__cxx11::wstring::operator=((wstring *)&id_extend.start,(wstring *)pwVar4);
      }
      token::~token((token *)local_120);
      parse_function_abi_cxx11_
                ((tuple<mjs::source_extend,_std::vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>,_std::unique_ptr<mjs::statement,_std::default_delete<mjs::statement>_>_>
                  *)&extend,in_RSI);
      params = (type *)std::
                       get<0ul,mjs::source_extend,std::vector<std::__cxx11::wstring,std::allocator<std::__cxx11::wstring>>,std::unique_ptr<mjs::statement,std::default_delete<mjs::statement>>>
                                 ((tuple<mjs::source_extend,_std::vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>,_std::unique_ptr<mjs::statement,_std::default_delete<mjs::statement>_>_>
                                   *)&extend);
      block = (type *)std::
                      get<1ul,mjs::source_extend,std::vector<std::__cxx11::wstring,std::allocator<std::__cxx11::wstring>>,std::unique_ptr<mjs::statement,std::default_delete<mjs::statement>>>
                                ((tuple<mjs::source_extend,_std::vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>,_std::unique_ptr<mjs::statement,_std::default_delete<mjs::statement>_>_>
                                  *)&extend);
      local_178._8_8_ =
           std::
           get<2ul,mjs::source_extend,std::vector<std::__cxx11::wstring,std::allocator<std::__cxx11::wstring>>,std::unique_ptr<mjs::statement,std::default_delete<mjs::statement>>>
                     ((tuple<mjs::source_extend,_std::vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>,_std::unique_ptr<mjs::statement,_std::default_delete<mjs::statement>_>_>
                       *)&extend);
      psVar5 = std::unique_ptr<mjs::statement,_std::default_delete<mjs::statement>_>::operator->
                         ((unique_ptr<mjs::statement,_std::default_delete<mjs::statement>_> *)
                          local_178._8_8_);
      iVar3 = (*(psVar5->super_syntax_node)._vptr_syntax_node[3])();
      if (iVar3 != 0) {
        __assert_fail("block->type() == statement_type::block",
                      "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/parser.cpp"
                      ,0x2c3,"expression_ptr mjs::parser::parse_member_expression()");
      }
      this_00 = (block_statement *)
                std::unique_ptr<mjs::statement,_std::default_delete<mjs::statement>_>::operator*
                          ((unique_ptr<mjs::statement,_std::default_delete<mjs::statement>_> *)
                           local_178._8_8_);
      bVar1 = block_statement::strict_mode(this_00);
      if (bVar1) {
        join_0x00000010_0x00000000_ =
             std::__cxx11::wstring::operator_cast_to_basic_string_view((wstring *)&id_extend.start);
        check_function_name(in_RSI,(wstring_view)join_0x00000010_0x00000000_,
                            (source_extend *)((long)&id_token.field_1 + 0x18));
      }
      make_expression<mjs::function_expression,mjs::source_extend&,std::__cxx11::wstring&,std::vector<std::__cxx11::wstring,std::allocator<std::__cxx11::wstring>>,std::unique_ptr<mjs::statement,std::default_delete<mjs::statement>>>
                (this,(source_extend *)in_RSI,
                 (basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)
                 params,(vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
                         *)&id_extend.start,block);
      local_190._12_4_ = 1;
      std::
      tuple<mjs::source_extend,_std::vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>,_std::unique_ptr<mjs::statement,_std::default_delete<mjs::statement>_>_>
      ::~tuple((tuple<mjs::source_extend,_std::vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>,_std::unique_ptr<mjs::statement,_std::default_delete<mjs::statement>_>_>
                *)&extend);
      source_extend::~source_extend((source_extend *)((long)&id_token.field_1 + 0x18));
      std::__cxx11::wstring::~wstring((wstring *)&id_extend.start);
      goto LAB_001e7f74;
    }
    parse_primary_expression((parser *)local_190);
    std::unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_>::operator=
              (&local_20,
               (unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_> *)local_190);
    std::unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_>::~unique_ptr
              ((unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_> *)local_190);
  }
  while( true ) {
    while( true ) {
      accept((parser *)&e_1,iVar3,(sockaddr *)0x32,(socklen_t *)args_2);
      bVar1 = token::operator_cast_to_bool((token *)&e_1);
      token::~token((token *)&e_1);
      if (!bVar1) break;
      parse_expression((parser *)local_1c0);
      expect((token *)(local_1f0 + 8),in_RSI,rbracket,"parse_member_expression",0x2ce);
      token::~token((token *)(local_1f0 + 8));
      local_220._44_4_ = 0x32;
      args_2 = &local_20;
      make_expression<mjs::binary_expression,mjs::token_type,std::unique_ptr<mjs::expression,std::default_delete<mjs::expression>>,std::unique_ptr<mjs::expression,std::default_delete<mjs::expression>>>
                ((parser *)local_1f0,(token_type *)in_RSI,
                 (unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_> *)
                 (local_220 + 0x2c),args_2);
      std::unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_>::operator=
                (&local_20,
                 (unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_> *)local_1f0);
      std::unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_>::~unique_ptr
                ((unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_> *)local_1f0);
      std::unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_>::~unique_ptr
                ((unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_> *)local_1c0);
    }
    accept((parser *)local_220,iVar3,(sockaddr *)0x25,(socklen_t *)args_2);
    bVar1 = token::operator_cast_to_bool((token *)local_220);
    token::~token((token *)local_220);
    if (!bVar1) break;
    local_238._12_4_ = 0x25;
    get_identifier_name_abi_cxx11_(&local_280,in_RSI,"parse_member_expression",0x2d1);
    token::token(&local_260,string_literal,&local_280);
    make_expression<mjs::literal_expression,mjs::token>((parser *)local_238,(token *)in_RSI);
    args_2 = &local_20;
    make_expression<mjs::binary_expression,mjs::token_type,std::unique_ptr<mjs::expression,std::default_delete<mjs::expression>>,std::unique_ptr<mjs::expression,std::default_delete<mjs::expression>>>
              ((parser *)local_228,(token_type *)in_RSI,
               (unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_> *)
               (local_238 + 0xc),args_2);
    std::unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_>::operator=
              (&local_20,
               (unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_> *)local_228);
    std::unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_>::~unique_ptr
              ((unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_> *)local_228);
    std::unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_>::~unique_ptr
              ((unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_> *)local_238);
    token::~token(&local_260);
    std::__cxx11::wstring::~wstring((wstring *)&local_280);
  }
  std::unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_>::unique_ptr
            ((unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_> *)this,&local_20);
  local_190._12_4_ = 1;
LAB_001e7f74:
  std::unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_>::~unique_ptr(&local_20);
  return (__uniq_ptr_data<mjs::expression,_std::default_delete<mjs::expression>,_true,_true>)
         (__uniq_ptr_data<mjs::expression,_std::default_delete<mjs::expression>,_true,_true>)this;
}

Assistant:

expression_ptr parse_member_expression() {
        // MemberExpression :
        //  PrimaryExpression
        //  FunctionExpression
        //  MemberExpression [ Expression ]
        //  MemberExpression . Identifier (IdentifierName in ES5+)
        //  new MemberExpression Arguments

        expression_ptr me{};
        if (accept(token_type::new_)) {
            auto e = parse_member_expression();
            if (current_token_type() == token_type::lparen) {
                e = make_expression<call_expression>(std::move(e), parse_argument_list());
            }
            me = make_expression<prefix_expression>(token_type::new_, std::move(e));
        } else if (version_ >= version::es3 && accept(token_type::function_)) {
            std::wstring id{};
            const auto id_extend = current_extend();
            if (auto id_token = accept(token_type::identifier)) {
                id = id_token.text();
            }
            auto [extend, params, block] = parse_function();
            assert(block->type() == statement_type::block);
            if (static_cast<const block_statement&>(*block).strict_mode()) {
                check_function_name(id, id_extend);
            }
            return make_expression<function_expression>(extend, id, std::move(params), std::move(block));
        } else {
            me = parse_primary_expression();
        }
        for (;;) {
            if (accept(token_type::lbracket)) {
                auto e = parse_expression();
                EXPECT(token_type::rbracket);
                me = make_expression<binary_expression>(token_type::lbracket, std::move(me), std::move(e));
            } else if (accept(token_type::dot)) {
                me = make_expression<binary_expression>(token_type::dot, std::move(me), make_expression<literal_expression>(token{token_type::string_literal, get_identifier_name(__func__, __LINE__)}));
            } else {
                return me;
            }
        }
    }